

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuinfo_x86.c
# Opt level: O2

void FillX86BrandString(char *brand_string)

{
  uint32_t max_cpuid_ext_leaf;
  Leaf LVar1;
  
  LVar1 = CpuId(0x80000000);
  max_cpuid_ext_leaf = LVar1.eax;
  SetString(max_cpuid_ext_leaf,0x80000002,brand_string);
  SetString(max_cpuid_ext_leaf,0x80000003,brand_string + 0x10);
  SetString(max_cpuid_ext_leaf,0x80000004,brand_string + 0x20);
  brand_string[0x30] = '\0';
  return;
}

Assistant:

void FillX86BrandString(char brand_string[49]) {
  const Leaf leaf_ext_0 = CpuId(0x80000000);
  const uint32_t max_cpuid_leaf_ext = leaf_ext_0.eax;
  SetString(max_cpuid_leaf_ext, 0x80000002, brand_string);
  SetString(max_cpuid_leaf_ext, 0x80000003, brand_string + 16);
  SetString(max_cpuid_leaf_ext, 0x80000004, brand_string + 32);
  brand_string[48] = '\0';
}